

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

Result<wallet::SelectionResult> *
wallet::SelectCoins(Result<wallet::SelectionResult> *__return_storage_ptr__,CWallet *wallet,
                   CoinsResult *available_coins,PreSelectedInputs *pre_set_inputs,
                   CAmount *nTargetValue,CCoinControl *coin_control,
                   CoinSelectionParams *coin_selection_params)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  T *pTVar4;
  int iVar5;
  optional<long> *poVar6;
  bilingual_str *this;
  long in_FS_OFFSET;
  SelectionResult preselected;
  Result<wallet::SelectionResult> op_selection_result;
  long local_250;
  bilingual_str local_248;
  SelectionResult local_208;
  undefined1 local_198 [112];
  __index_type local_128;
  bilingual_str local_120;
  SelectionResult local_e0;
  bilingual_str local_70;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_250 = *nTargetValue - pre_set_inputs->total_amount;
  if (local_250 < 1 || coin_control->m_allow_other_inputs != false) {
    if (local_250 < 1) {
      local_198._24_8_ = local_198 + 8;
      local_198._8_4_ = _S_red;
      local_198._16_8_ = (_Base_ptr)0x0;
      local_198._40_8_ = 0;
      local_198[0x38] = MANUAL;
      local_198[0x39] = false;
      local_198[0x48] = false;
      local_198[0x50] = true;
      local_198._96_4_ = 0;
      local_198._104_8_ = 0;
      local_198._32_8_ = local_198._24_8_;
      local_198._48_8_ = *nTargetValue;
      SelectionResult::AddInputs
                ((SelectionResult *)local_198,&pre_set_inputs->coins,
                 coin_selection_params->m_subtract_fee_outputs);
      SelectionResult::RecalculateWaste
                ((SelectionResult *)local_198,coin_selection_params->min_viable_change,
                 coin_selection_params->m_cost_of_change,coin_selection_params->m_change_fee);
      SelectionResult::SelectionResult(&local_e0,(SelectionResult *)local_198);
      std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>::
      _Variant_storage<1ul,wallet::SelectionResult>
                ((_Variant_storage<false,bilingual_str,wallet::SelectionResult> *)
                 __return_storage_ptr__,&local_e0);
      _GLOBAL__N_1::std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&local_e0);
      _GLOBAL__N_1::std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)local_198);
      goto LAB_0044efab;
    }
    if (coin_selection_params->m_subtract_fee_outputs == true) {
      poVar6 = (optional<long> *)&available_coins->total_amount;
LAB_0044ef5b:
      if (local_250 <=
          (poVar6->super__Optional_base<long,_true,_true>)._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value) {
        AutomaticCoinSelection
                  ((Result<wallet::SelectionResult> *)local_198,wallet,available_coins,&local_250,
                   coin_selection_params);
        if ((local_128 == '\x01') &&
           ((pre_set_inputs->coins)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
          local_208.m_target = pre_set_inputs->total_amount;
          local_208.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_208.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
          local_208.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
          ;
          local_208.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          local_208.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_208.m_algo = MANUAL;
          local_208.m_use_effective = false;
          local_208.m_waste.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_engaged = false;
          local_208.m_algo_completed = true;
          local_208.m_weight = 0;
          local_208.bump_fee_group_discount = 0;
          local_208.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_208.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          SelectionResult::AddInputs
                    (&local_208,&pre_set_inputs->coins,coin_selection_params->m_subtract_fee_outputs
                    );
          pTVar4 = util::Result<wallet::SelectionResult>::value
                             ((Result<wallet::SelectionResult> *)local_198);
          SelectionResult::Merge(pTVar4,&local_208);
          pTVar4 = util::Result<wallet::SelectionResult>::value
                             ((Result<wallet::SelectionResult> *)local_198);
          SelectionResult::RecalculateWaste
                    (pTVar4,coin_selection_params->min_viable_change,
                     coin_selection_params->m_cost_of_change,coin_selection_params->m_change_fee);
          bVar1 = (coin_selection_params->m_max_tx_weight).super__Optional_base<int,_true,_true>.
                  _M_payload.super__Optional_payload_base<int>._M_engaged;
          iVar2 = coin_selection_params->tx_noinputs_size;
          iVar3 = (coin_selection_params->m_max_tx_weight).super__Optional_base<int,_true,_true>.
                  _M_payload.super__Optional_payload_base<int>._M_payload._M_value;
          pTVar4 = util::Result<wallet::SelectionResult>::value
                             ((Result<wallet::SelectionResult> *)local_198);
          iVar5 = 400000;
          if (bVar1 != false) {
            iVar5 = iVar3;
          }
          if (pTVar4->m_weight <= iVar5 + iVar2 * -4) {
            _GLOBAL__N_1::std::
            _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
            ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                         *)&local_208);
            goto LAB_0044f0f7;
          }
          _(&local_248,(ConstevalStringLiteral)0x6f7366);
          std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>::
          _Variant_storage<0ul,bilingual_str>
                    ((_Variant_storage<false,bilingual_str,wallet::SelectionResult> *)
                     __return_storage_ptr__,&local_248);
          bilingual_str::~bilingual_str(&local_248);
          _GLOBAL__N_1::std::
          _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                       *)&local_208);
        }
        else {
LAB_0044f0f7:
          std::__detail::__variant::_Move_ctor_base<false,_bilingual_str,_wallet::SelectionResult>::
          _Move_ctor_base((_Move_ctor_base<false,_bilingual_str,_wallet::SelectionResult> *)
                          __return_storage_ptr__,
                          (_Move_ctor_base<false,_bilingual_str,_wallet::SelectionResult> *)
                          local_198);
        }
        std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
        ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)
                          local_198);
        goto LAB_0044efab;
      }
    }
    else if (((available_coins->total_effective_amount).super__Optional_base<long,_true,_true>.
              _M_payload.super__Optional_payload_base<long>._M_engaged & 1U) != 0) {
      poVar6 = &available_coins->total_effective_amount;
      goto LAB_0044ef5b;
    }
    local_120.original._M_dataplus._M_p = (pointer)&local_120.original.field_2;
    local_120.translated._M_string_length = 0;
    local_120.translated.field_2._8_8_ = 0;
    local_120.original.field_2._M_allocated_capacity = 0;
    local_120.original.field_2._8_8_ = 0;
    local_120.original._M_string_length = 0;
    local_120.translated._M_dataplus._M_p = (pointer)&local_120.translated.field_2;
    local_120.translated.field_2._M_allocated_capacity = 0;
    std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,wallet::SelectionResult> *)
               __return_storage_ptr__,&local_120);
    this = &local_120;
  }
  else {
    _(&local_70,(ConstevalStringLiteral)0x6f72c6);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,wallet::SelectionResult> *)
               __return_storage_ptr__,&local_70);
    this = &local_70;
  }
  bilingual_str::~bilingual_str(this);
LAB_0044efab:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<SelectionResult> SelectCoins(const CWallet& wallet, CoinsResult& available_coins, const PreSelectedInputs& pre_set_inputs,
                                          const CAmount& nTargetValue, const CCoinControl& coin_control,
                                          const CoinSelectionParams& coin_selection_params)
{
    // Deduct preset inputs amount from the search target
    CAmount selection_target = nTargetValue - pre_set_inputs.total_amount;

    // Return if automatic coin selection is disabled, and we don't cover the selection target
    if (!coin_control.m_allow_other_inputs && selection_target > 0) {
        return util::Error{_("The preselected coins total amount does not cover the transaction target. "
                             "Please allow other inputs to be automatically selected or include more coins manually")};
    }

    // Return if we can cover the target only with the preset inputs
    if (selection_target <= 0) {
        SelectionResult result(nTargetValue, SelectionAlgorithm::MANUAL);
        result.AddInputs(pre_set_inputs.coins, coin_selection_params.m_subtract_fee_outputs);
        result.RecalculateWaste(coin_selection_params.min_viable_change, coin_selection_params.m_cost_of_change, coin_selection_params.m_change_fee);
        return result;
    }

    // Return early if we cannot cover the target with the wallet's UTXO.
    // We use the total effective value if we are not subtracting fee from outputs and 'available_coins' contains the data.
    CAmount available_coins_total_amount = coin_selection_params.m_subtract_fee_outputs ? available_coins.GetTotalAmount() :
            (available_coins.GetEffectiveTotalAmount().has_value() ? *available_coins.GetEffectiveTotalAmount() : 0);
    if (selection_target > available_coins_total_amount) {
        return util::Error(); // Insufficient funds
    }

    // Start wallet Coin Selection procedure
    auto op_selection_result = AutomaticCoinSelection(wallet, available_coins, selection_target, coin_selection_params);
    if (!op_selection_result) return op_selection_result;

    // If needed, add preset inputs to the automatic coin selection result
    if (!pre_set_inputs.coins.empty()) {
        SelectionResult preselected(pre_set_inputs.total_amount, SelectionAlgorithm::MANUAL);
        preselected.AddInputs(pre_set_inputs.coins, coin_selection_params.m_subtract_fee_outputs);
        op_selection_result->Merge(preselected);
        op_selection_result->RecalculateWaste(coin_selection_params.min_viable_change,
                                                coin_selection_params.m_cost_of_change,
                                                coin_selection_params.m_change_fee);

        // Verify we haven't exceeded the maximum allowed weight
        int max_inputs_weight = coin_selection_params.m_max_tx_weight.value_or(MAX_STANDARD_TX_WEIGHT) - (coin_selection_params.tx_noinputs_size * WITNESS_SCALE_FACTOR);
        if (op_selection_result->GetWeight() > max_inputs_weight) {
            return util::Error{_("The combination of the pre-selected inputs and the wallet automatic inputs selection exceeds the transaction maximum weight. "
                                 "Please try sending a smaller amount or manually consolidating your wallet's UTXOs")};
        }
    }
    return op_selection_result;
}